

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmq.c
# Opt level: O2

int nni_lmq_get(nni_lmq *lmq,nng_msg **mp)

{
  nng_msg *pnVar1;
  
  if (lmq->lmq_len != 0) {
    pnVar1 = lmq->lmq_msgs[lmq->lmq_get];
    lmq->lmq_get = lmq->lmq_get + 1 & lmq->lmq_mask;
    lmq->lmq_len = lmq->lmq_len - 1;
    *mp = pnVar1;
    return 0;
  }
  return 8;
}

Assistant:

int
nni_lmq_get(nni_lmq *lmq, nng_msg **mp)
{
	nng_msg *msg;
	if (lmq->lmq_len == 0) {
		return (NNG_EAGAIN);
	}
	msg = lmq->lmq_msgs[lmq->lmq_get++];
	lmq->lmq_get &= lmq->lmq_mask;
	lmq->lmq_len--;
	*mp = msg;
	return (0);
}